

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O0

void __thiscall pg::SPMSolver::run(SPMSolver *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  void *pvVar18;
  ostream *poVar19;
  reference pvVar20;
  reference piVar21;
  Error *this_00;
  char *pcVar22;
  int local_4f0;
  int local_2d4;
  int winner;
  int *pm_1;
  int n_11;
  int n_10;
  int d_2;
  int n_9;
  iterator __end4_2;
  iterator __begin4_2;
  vector<int,_std::allocator<int>_> *__range4_2;
  int *piStack_1b8;
  int to_1;
  int *curedge_6;
  bool escapes_1;
  int *piStack_1a8;
  int m_2;
  int *curedge_5;
  int n_8;
  int m_1;
  int *curedge_4;
  int *piStack_188;
  int m;
  int *curedge_3;
  bool escapes;
  iterator iStack_178;
  int n_7;
  iterator __end4_1;
  iterator __begin4_1;
  vector<int,_std::allocator<int>_> *__range4_1;
  iterator iStack_158;
  int n_6;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  int i_6;
  int *pm_to;
  int *piStack_128;
  int to;
  int *curedge_2;
  int d_1;
  int d;
  int c;
  int *pm;
  int n_5;
  int max;
  int i_5;
  int best_to;
  int best_from;
  int pl;
  int n_4;
  int from_1;
  int *curedge_1;
  int64_t iStack_d8;
  int n_3;
  int64_t last_update;
  int *piStack_c8;
  int from;
  int *curedge;
  int local_ac;
  undefined1 local_a8 [4];
  int n_2;
  vector<int,_std::allocator<int>_> cycles;
  queue<int,_std::deque<int,_std::allocator<int>_>_> cm_queue;
  int n_1;
  int *cm;
  int n;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int max1;
  int max0;
  SPMSolver *this_local;
  
  lVar14 = Solver::nodecount(&this->super_Solver);
  iVar10 = Solver::priority(&this->super_Solver,(int)lVar14 + -1);
  this->k = (long)(iVar10 + 1);
  if (this->k < 2) {
    this->k = 2;
  }
  lVar14 = this->k;
  lVar15 = Solver::nodecount(&this->super_Solver);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lVar14 * lVar15;
  uVar16 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar16);
  this->pms = piVar17;
  uVar16 = Solver::nodecount(&this->super_Solver);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar16;
  uVar16 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar16);
  this->strategy = piVar17;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->k;
  uVar16 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar16);
  this->counts = piVar17;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->k;
  uVar16 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar16);
  this->tmp = piVar17;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->k;
  uVar16 = SUB168(auVar5 * ZEXT816(4),0);
  if (SUB168(auVar5 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar16);
  this->best = piVar17;
  uVar16 = Solver::nodecount(&this->super_Solver);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar16;
  uVar16 = SUB168(auVar6 * ZEXT816(4),0);
  if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar16);
  this->dirty = piVar17;
  uVar16 = Solver::nodecount(&this->super_Solver);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar16;
  uVar16 = SUB168(auVar7 * ZEXT816(4),0);
  if (SUB168(auVar7 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  piVar17 = (int *)operator_new__(uVar16);
  this->unstable = piVar17;
  i = -1;
  i_1 = -1;
  for (i_2 = 0; lVar14 = this->k, lVar15 = Solver::nodecount(&this->super_Solver),
      (long)i_2 < lVar14 * lVar15; i_2 = i_2 + 1) {
    this->pms[i_2] = 0;
  }
  for (i_3 = 0; lVar14 = Solver::nodecount(&this->super_Solver), i_3 < lVar14; i_3 = i_3 + 1) {
    this->strategy[i_3] = -1;
  }
  for (i_4 = 0; (long)i_4 < this->k; i_4 = i_4 + 1) {
    this->counts[i_4] = 0;
  }
  for (n = 0; lVar14 = Solver::nodecount(&this->super_Solver), n < lVar14; n = n + 1) {
    bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)n);
    if (!bVar9) {
      piVar17 = this->counts;
      iVar10 = Solver::priority(&this->super_Solver,n);
      piVar17[iVar10] = piVar17[iVar10] + 1;
    }
  }
  cm._4_4_ = (uint)this->k;
  do {
    do {
      cm._4_4_ = cm._4_4_ - 1;
      if ((int)cm._4_4_ < 0) goto LAB_00212921;
    } while (this->counts[(int)cm._4_4_] == 0);
    if ((cm._4_4_ & 1) == 0) {
      if (i == -1) {
        i = cm._4_4_;
      }
    }
    else if (i_1 == -1) {
      i_1 = cm._4_4_;
    }
  } while ((i == -1) || (i == -1));
LAB_00212921:
  for (cm._0_4_ = 0; lVar14 = Solver::nodecount(&this->super_Solver), (int)cm < lVar14;
      cm._0_4_ = (int)cm + 1) {
    this->dirty[(int)cm] = 0;
  }
  uVar16 = Solver::nodecount(&this->super_Solver);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar16;
  uVar16 = SUB168(auVar8 * ZEXT816(4),0);
  if (SUB168(auVar8 * ZEXT816(4),8) != 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar18 = operator_new__(uVar16);
  for (cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node._4_4_ = 0; lVar14 = Solver::nodecount(&this->super_Solver),
      cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._4_4_ < lVar14;
      cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_node._4_4_ =
           cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node._4_4_ + 1) {
    *(undefined4 *)
     ((long)pvVar18 +
     (long)cm_queue.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node._4_4_ * 4) = 0;
  }
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)
             &cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_a8);
  this->lift_attempt = 0;
  this->lift_count = 0;
  lVar14 = Solver::nodecount(&this->super_Solver);
  local_ac = (int)lVar14;
  while (local_ac = local_ac + -1, -1 < local_ac) {
    bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)local_ac);
    if ((!bVar9) && (bVar9 = lift(this,local_ac,-1), bVar9)) {
      for (piStack_c8 = Solver::ins(&this->super_Solver,local_ac); *piStack_c8 != -1;
          piStack_c8 = piStack_c8 + 1) {
        last_update._4_4_ = *piStack_c8;
        bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)last_update._4_4_);
        if ((!bVar9) && (bVar9 = lift(this,last_update._4_4_,local_ac), bVar9)) {
          todo_push(this,last_update._4_4_);
        }
      }
    }
  }
  iStack_d8 = 0;
  do {
    while (bVar9 = std::deque<int,_std::allocator<int>_>::empty(&this->todo),
          ((bVar9 ^ 0xffU) & 1) != 0) {
      curedge_1._4_4_ = todo_pop(this);
      for (_n_4 = Solver::ins(&this->super_Solver,curedge_1._4_4_); lVar14 = iStack_d8, *_n_4 != -1;
          _n_4 = _n_4 + 1) {
        pl = *_n_4;
        bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)pl);
        if ((!bVar9) && (bVar9 = lift(this,pl,curedge_1._4_4_), bVar9)) {
          todo_push(this,pl);
        }
      }
      lVar15 = Solver::nodecount(&this->super_Solver);
      if (lVar14 + lVar15 * 10 < this->lift_count) {
        iStack_d8 = this->lift_count;
        update(this,0);
        update(this,1);
      }
    }
    if (1 < (this->super_Solver).trace) {
      for (best_from = 0; lVar14 = (long)best_from, lVar15 = Solver::nodecount(&this->super_Solver),
          lVar14 < lVar15; best_from = best_from + 1) {
        bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)best_from);
        if (!bVar9) {
          poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[35m**\x1b[m \x1b[1mnode ");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,best_from);
          poVar19 = std::operator<<(poVar19,"/");
          iVar10 = Solver::priority(&this->super_Solver,best_from);
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
          iVar10 = Solver::owner(&this->super_Solver,best_from);
          pcVar22 = " (even)";
          if (iVar10 != 0) {
            pcVar22 = " (odd)";
          }
          poVar19 = std::operator<<(poVar19,pcVar22);
          std::operator<<(poVar19,"\x1b[m is");
          pm_stream(this,(this->super_Solver).logger,this->pms + this->k * (long)best_from);
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
      }
    }
    for (best_to = 0; best_to < 2; best_to = best_to + 1) {
      i_5 = -1;
      max = -1;
      for (n_5 = 0; (long)n_5 < this->k; n_5 = n_5 + 1) {
        this->best[n_5] = 0;
      }
      if (best_to == 0) {
        local_2d4 = i;
      }
      else {
        local_2d4 = i_1;
      }
      pm._4_4_ = local_2d4;
      for (pm._0_4_ = 0; lVar14 = (long)(int)pm, lVar15 = Solver::nodecount(&this->super_Solver),
          lVar14 < lVar15; pm._0_4_ = (int)pm + 1) {
        bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)(int)pm);
        if (((!bVar9) && (piVar17 = this->pms + this->k * (long)(int)pm, piVar17[best_to] != -1)) &&
           (iVar10 = pm_cycles(this,piVar17,best_to), iVar10 != -1)) {
          if (1 < (this->super_Solver).trace) {
            poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[31;1m");
            pcVar22 = " even";
            if (best_to != 0) {
              pcVar22 = " odd";
            }
            poVar19 = std::operator<<(poVar19,pcVar22 + 1);
            iVar12 = best_to;
            iVar11 = Solver::owner(&this->super_Solver,(int)pm);
            pcVar22 = " loser ";
            if (iVar12 == iVar11) {
              pcVar22 = " winner ";
            }
            std::operator<<(poVar19,pcVar22);
            poVar19 = std::operator<<((this->super_Solver).logger,"loops\x1b[m: ");
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)pm);
            poVar19 = std::operator<<(poVar19,"/");
            iVar12 = Solver::priority(&this->super_Solver,(int)pm);
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar12);
            poVar19 = std::operator<<(poVar19," (cm = ");
            iVar12 = pm_cycles(this,piVar17,best_to);
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar12);
            std::operator<<(poVar19,")");
            pm_stream(this,(this->super_Solver).logger,piVar17);
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
          if (iVar10 == pm._4_4_) {
            this->pms[(long)(int)pm * this->k + (long)best_to] = -1;
            todo_push(this,(int)pm);
            uVar13 = Solver::priority(&this->super_Solver,(int)pm);
            if ((uVar13 & 1) == best_to) {
              this->counts[(int)uVar13] = this->counts[(int)uVar13] + -1;
            }
            if ((this->super_Solver).trace != 0) {
              poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;36mupdated node ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,(int)pm);
              poVar19 = std::operator<<(poVar19,"/");
              iVar10 = Solver::priority(&this->super_Solver,(int)pm);
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
              iVar10 = Solver::owner(&this->super_Solver,(int)pm);
              pcVar22 = " (even)";
              if (iVar10 != 0) {
                pcVar22 = " (odd)";
              }
              poVar19 = std::operator<<(poVar19,pcVar22);
              std::operator<<(poVar19,"\x1b[m to");
              pm_stream(this,(this->super_Solver).logger,this->pms + (long)(int)pm * this->k);
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)local_a8,(value_type_conflict *)&pm);
            iVar10 = Solver::owner(&this->super_Solver,(int)pm);
            if (iVar10 != best_to) {
              iVar10 = Solver::priority(&this->super_Solver,(int)pm);
              for (piStack_128 = Solver::outs(&this->super_Solver,(int)pm); *piStack_128 != -1;
                  piStack_128 = piStack_128 + 1) {
                iVar12 = *piStack_128;
                bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)iVar12);
                if ((!bVar9) && ((this->pms + this->k * (long)iVar12)[best_to] != -1)) {
                  Prog(this,this->tmp,this->pms + this->k * (long)iVar12,iVar10,best_to);
                  bVar9 = pm_less(this,this->pms + this->k * (long)(int)pm,this->tmp,iVar10,best_to)
                  ;
                  if ((bVar9) &&
                     ((max == -1 || (bVar9 = pm_less(this,this->tmp,this->best,0,best_to), bVar9))))
                  {
                    for (__range4._4_4_ = best_to; (long)__range4._4_4_ < this->k;
                        __range4._4_4_ = __range4._4_4_ + 2) {
                      this->best[__range4._4_4_] = this->tmp[__range4._4_4_];
                    }
                    i_5 = (int)pm;
                    max = iVar12;
                  }
                }
              }
            }
          }
        }
      }
      if (max == -1) {
        __end4 = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_a8);
        iStack_158 = std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_a8);
        while (bVar9 = __gnu_cxx::operator!=(&__end4,&stack0xfffffffffffffea8), bVar9) {
          piVar21 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end4);
          *(undefined4 *)((long)pvVar18 + (long)*piVar21 * 4) = 1;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4);
        }
        __end4_1 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)local_a8);
        iStack_178 = std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)local_a8);
        while (bVar9 = __gnu_cxx::operator!=(&__end4_1,&stack0xfffffffffffffe88), bVar9) {
          piVar21 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end4_1);
          curedge_3._4_4_ = *piVar21;
          iVar10 = Solver::owner(&this->super_Solver,curedge_3._4_4_);
          if (iVar10 == best_to) {
            curedge_3._3_1_ = 1;
            for (piStack_188 = Solver::outs(&this->super_Solver,curedge_3._4_4_); *piStack_188 != -1
                ; piStack_188 = piStack_188 + 1) {
              curedge_4._4_4_ = *piStack_188;
              bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)curedge_4._4_4_);
              if ((!bVar9) && (*(int *)((long)pvVar18 + (long)curedge_4._4_4_ * 4) != 0)) {
                curedge_3._3_1_ = 0;
                break;
              }
            }
          }
          else {
            curedge_3._3_1_ = 0;
            for (_n_8 = Solver::outs(&this->super_Solver,curedge_3._4_4_); *_n_8 != -1;
                _n_8 = _n_8 + 1) {
              curedge_5._4_4_ = *_n_8;
              bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)curedge_5._4_4_);
              if (((!bVar9) && (this->pms[this->k * (long)curedge_5._4_4_ + (long)best_to] != -1))
                 && (*(int *)((long)pvVar18 + (long)curedge_5._4_4_ * 4) == 0)) {
                curedge_3._3_1_ = 1;
                break;
              }
            }
          }
          if ((curedge_3._3_1_ & 1) != 0) {
            *(undefined4 *)((long)pvVar18 + (long)curedge_3._4_4_ * 4) = 0;
            std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                      ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                       &cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (value_type *)((long)&curedge_3 + 4));
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4_1);
        }
        while (bVar9 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                                 ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                                  &cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage),
              ((bVar9 ^ 0xffU) & 1) != 0) {
          pvVar20 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                               &cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage);
          curedge_5._0_4_ = *pvVar20;
          std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                     &cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          for (piStack_1a8 = Solver::ins(&this->super_Solver,(value_type)curedge_5);
              *piStack_1a8 != -1; piStack_1a8 = piStack_1a8 + 1) {
            curedge_6._4_4_ = *piStack_1a8;
            bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)curedge_6._4_4_);
            if ((!bVar9) && (*(int *)((long)pvVar18 + (long)curedge_6._4_4_ * 4) != 0)) {
              iVar10 = Solver::owner(&this->super_Solver,curedge_6._4_4_);
              if (iVar10 == best_to) {
                curedge_6._3_1_ = 0;
                for (piStack_1b8 = Solver::outs(&this->super_Solver,curedge_6._4_4_);
                    *piStack_1b8 != -1; piStack_1b8 = piStack_1b8 + 1) {
                  iVar10 = *piStack_1b8;
                  bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)iVar10);
                  if ((!bVar9) && (*(int *)((long)pvVar18 + (long)iVar10 * 4) != 0)) {
                    curedge_6._3_1_ = 1;
                    break;
                  }
                }
                if ((curedge_6._3_1_ & 1) != 0) goto LAB_00213d00;
              }
              *(undefined4 *)((long)pvVar18 + (long)curedge_6._4_4_ * 4) = 0;
              std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                        ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                         &cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (value_type *)((long)&curedge_6 + 4));
            }
LAB_00213d00:
          }
        }
        __end4_2 = std::vector<int,_std::allocator<int>_>::begin
                             ((vector<int,_std::allocator<int>_> *)local_a8);
        _d_2 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_a8);
        while (bVar9 = __gnu_cxx::operator!=
                                 (&__end4_2,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)&d_2), bVar9) {
          piVar21 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end4_2);
          iVar10 = *piVar21;
          if (*(int *)((long)pvVar18 + (long)iVar10 * 4) != 0) {
            *(undefined4 *)((long)pvVar18 + (long)iVar10 * 4) = 0;
            this->pms[(long)iVar10 * this->k + (long)best_to] = -1;
            todo_push(this,iVar10);
            uVar13 = Solver::priority(&this->super_Solver,iVar10);
            if ((uVar13 & 1) == best_to) {
              this->counts[(int)uVar13] = this->counts[(int)uVar13] + -1;
            }
            if ((this->super_Solver).trace != 0) {
              poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;36mupdated node ");
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
              poVar19 = std::operator<<(poVar19,"/");
              iVar12 = Solver::priority(&this->super_Solver,iVar10);
              poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar12);
              iVar12 = Solver::owner(&this->super_Solver,iVar10);
              pcVar22 = " (even)";
              if (iVar12 != 0) {
                pcVar22 = " (odd)";
              }
              poVar19 = std::operator<<(poVar19,pcVar22);
              std::operator<<(poVar19,"\x1b[m to");
              pm_stream(this,(this->super_Solver).logger,this->pms + (long)iVar10 * this->k);
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end4_2);
        }
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_a8)
        ;
      }
      else {
        this->strategy[i_5] = max;
        pm_copy(this,this->pms + (long)i_5 * this->k,this->best,best_to);
        todo_push(this,i_5);
        if ((this->super_Solver).trace != 0) {
          poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;36mupdated node ");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,i_5);
          poVar19 = std::operator<<(poVar19,"/");
          iVar10 = Solver::priority(&this->super_Solver,i_5);
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
          iVar10 = Solver::owner(&this->super_Solver,i_5);
          pcVar22 = " (even)";
          if (iVar10 != 0) {
            pcVar22 = " (odd)";
          }
          poVar19 = std::operator<<(poVar19,pcVar22);
          std::operator<<(poVar19,"\x1b[m to");
          pm_stream(this,(this->super_Solver).logger,this->pms + (long)i_5 * this->k);
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
        std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_a8)
        ;
      }
      if (this->counts[pm._4_4_] == 0) {
        if (1 < (this->super_Solver).trace) {
          poVar19 = std::operator<<((this->super_Solver).logger,
                                    "\x1b[1mlowering max\x1b[m for player ");
          pcVar22 = " odd";
          if (best_to == 0) {
            pcVar22 = " even";
          }
          poVar19 = std::operator<<(poVar19,pcVar22 + 1);
          std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
        }
        if (best_to == 0) {
          while( true ) {
            bVar9 = false;
            if (0 < i) {
              bVar9 = this->counts[i] == 0;
            }
            if (!bVar9) break;
            i = i + -2;
          }
        }
        else {
          while( true ) {
            bVar9 = false;
            if (0 < i_1) {
              bVar9 = this->counts[i_1] == 0;
            }
            if (!bVar9) break;
            i_1 = i_1 + -2;
          }
        }
      }
    }
    bVar9 = std::deque<int,_std::allocator<int>_>::empty(&this->todo);
    if (bVar9) {
      if (1 < (this->super_Solver).trace) {
        for (pm_1._4_4_ = 0; lVar14 = Solver::nodecount(&this->super_Solver), pm_1._4_4_ < lVar14;
            pm_1._4_4_ = pm_1._4_4_ + 1) {
          bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)pm_1._4_4_);
          if (!bVar9) {
            poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[35m**\x1b[m \x1b[1mnode ");
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,pm_1._4_4_);
            poVar19 = std::operator<<(poVar19,"/");
            iVar10 = Solver::priority(&this->super_Solver,pm_1._4_4_);
            poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar10);
            iVar10 = Solver::owner(&this->super_Solver,pm_1._4_4_);
            pcVar22 = " (even)";
            if (iVar10 != 0) {
              pcVar22 = " (odd)";
            }
            poVar19 = std::operator<<(poVar19,pcVar22);
            std::operator<<(poVar19,"\x1b[m is");
            pm_stream(this,(this->super_Solver).logger,this->pms + this->k * (long)pm_1._4_4_);
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
        }
      }
      pm_1._0_4_ = 0;
      do {
        lVar14 = Solver::nodecount(&this->super_Solver);
        if (lVar14 <= (int)pm_1) {
          if (this->pms != (int *)0x0) {
            operator_delete__(this->pms);
          }
          if (this->strategy != (int *)0x0) {
            operator_delete__(this->strategy);
          }
          if (this->counts != (int *)0x0) {
            operator_delete__(this->counts);
          }
          if (this->tmp != (int *)0x0) {
            operator_delete__(this->tmp);
          }
          if (this->best != (int *)0x0) {
            operator_delete__(this->best);
          }
          if (this->dirty != (int *)0x0) {
            operator_delete__(this->dirty);
          }
          if (pvVar18 != (void *)0x0) {
            operator_delete__(pvVar18);
          }
          if (this->unstable != (int *)0x0) {
            operator_delete__(this->unstable);
          }
          poVar19 = std::operator<<((this->super_Solver).logger,"solved with ");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->lift_count);
          poVar19 = std::operator<<(poVar19," lifts, ");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->lift_attempt);
          poVar19 = std::operator<<(poVar19," lift attempts.");
          std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)local_a8);
          std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
                    ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)
                     &cycles.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          return;
        }
        bVar9 = bitset::operator[]((this->super_Solver).disabled,(long)(int)pm_1);
        if (!bVar9) {
          piVar17 = this->pms + this->k * (long)(int)pm_1;
          if ((*piVar17 == -1) == (piVar17[1] == -1)) {
            this_00 = (Error *)__cxa_allocate_exception(0x40);
            Error::Error(this_00,"logic error",
                         "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/spm.cpp"
                         ,0x273);
            __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
          }
          iVar10 = *piVar17;
          uVar13 = Solver::owner(&this->super_Solver,(int)pm_1);
          if (uVar13 == (iVar10 != -1)) {
            local_4f0 = this->strategy[(int)pm_1];
          }
          else {
            local_4f0 = -1;
          }
          Solver::solve(&this->super_Solver,(int)pm_1,(uint)(iVar10 != -1),local_4f0);
        }
        pm_1._0_4_ = (int)pm_1 + 1;
      } while( true );
    }
  } while( true );
}

Assistant:

void
SPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    int max0 = -1, max1 = -1;

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;
    for (int i=k-1; i>=0; i--) {
        if (counts[i] == 0) continue;
        if (i&1) { if (max1 == -1) max1 = i; }
        else { if (max0 == -1) max0 = i; }
        if (max0 != -1 and max0 != -1) break;
    }

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // allocate and initialize additional array for cycle measures
    int *cm = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) cm[n] = 0;

    // a queue and a vector for cycle measure analysis
    std::queue<int> cm_queue;
    std::vector<int> cycles;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    int64_t last_update = 0;

    while (true) {
        while (!todo.empty()) {
            int n = todo_pop();
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
            if (last_update + 10*nodecount() < lift_count) {
                last_update = lift_count;
                update(0);
                update(1);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
                pm_stream(logger, pms + k*n);
                logger << std::endl;
            }
        }
#endif

        /**
         * End of the main loop.
         * When no more lifting occurs, we must analyze nodes with cyclic measures.
         * We analyze for player 0 first, then for player 1.
         */

        for (int pl=0; pl<2; pl++) {
            /**
             * Put all nodes with cycle measures in "cycles"
             * Also find the best (lowest) exit for the loser
             */
            int best_from = -1, best_to = -1;
            for (int i=0; i<k; i++) best[i] = 0;

            int max = pl == 0 ? max0 : max1;

            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                int *pm = pms + k*n;
                if (pm[pl] == -1) continue; // already won
                int c = pm_cycles(pm, pl);
                if (c == -1) continue; // not a cycle measure
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[31;1m" << (pl ? "odd" : "even") << (pl == owner(n) ? " winner " : " loser ");
                    logger << "loops\033[m: " << n << "/" << priority(n) << " (cm = " << pm_cycles(pm, pl) << ")";
                    pm_stream(logger, pm);
                    logger << std::endl;
                }
#endif
                if (c == max) {
                    pms[n*k + pl] = -1;
                    todo_push(n);

                    const int d = priority(n);
                    if ((d&1) == pl) counts[d]--;

                    if (trace) {
                        logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                        pm_stream(logger, pms + n*k);
                        logger << std::endl;
                    }

                    continue;
                }

                cycles.push_back(n);
                if (owner(n) != pl) {
                    const int d = priority(n);
                    for (auto curedge = outs(n); *curedge != -1; curedge++) {
                        int to = *curedge;
                        if (disabled[to]) continue;
                        int *pm_to = pms + k*to;
                        if (pm_to[pl] == -1) continue; // already won
                        Prog(tmp, pm_to, d, pl);
                        if (!pm_less(pms + k*n, tmp, d, pl)) continue; // candidate must increase measure
                        if (best_to == -1 or pm_less(tmp, best, 0, pl))  {
                            for (int i=pl; i<k; i+=2) best[i] = tmp[i];
                            best_from = n;
                            best_to = to;
                        }
                    }
                }
            }

            if (best_to != -1) {
                /**
                 * OK we found the best exit from <best_from> to <best_to>.
                 */
                strategy[best_from] = best_to;
                pm_copy(pms + best_from*k, best, pl);
                todo_push(best_from);

                if (trace) {
                    logger << "\033[1;36mupdated node " << best_from << "/" << priority(best_from) << (owner(best_from)?" (odd)":" (even)") << "\033[m to";
                    pm_stream(logger, pms + best_from*k);
                    logger << std::endl;
                }

                cycles.clear();
            } else {
                /**
                 * No exit found, everything that remains a cycle after removing escaping nodes is now won.
                 */
                for (int n : cycles) cm[n] = 1; // mark everything in 'cycles'

                for (int n : cycles) {
                    bool escapes;
                    if (owner(n) == pl) {
                        // check if it can stay in cm
                        escapes = true;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and cm[m]) {
                                escapes = false;
                                break;
                            }
                        }
                    } else {
                        // check if it can move out of cm
                        escapes = false;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and pms[k*m+pl] != -1 and cm[m] == 0) {
                                escapes = true;
                                break;
                            }
                        }
                    }
                    if (escapes) {
                        cm[n] = 0;
                        cm_queue.push(n);
                    }
                }

                /**
                 * Run backwards search to remove nodes that can escape to non-CM
                 */

                while (!cm_queue.empty()) {
                    int n = cm_queue.front();
                    cm_queue.pop();
                    for (auto curedge = ins(n); *curedge != -1; curedge++) {
                        int m = *curedge;
                        if (disabled[m] != 0 or cm[m] == 0) continue;
                        if (owner(m) == pl) {
                            bool escapes = false;
                            for (auto curedge = outs(m); *curedge != -1; curedge++) {
                                int to = *curedge;
                                if (disabled[to] == 0 and cm[to]) {
                                    escapes = true;
                                    break;
                                }
                            }
                            if (escapes) continue;
                        }
                        cm[m] = 0;
                        cm_queue.push(m);
                    }
                }

                /**
                 * Finally, mark remaining nodes as won
                 */

                for (int n : cycles) {
                    if (cm[n]) {
                        cm[n] = 0;
                        pms[n*k + pl] = -1;
                        todo_push(n);

                        const int d = priority(n);
                        if ((d&1) == pl) counts[d]--;

                        if (trace) {
                            logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                            pm_stream(logger, pms + n*k);
                            logger << std::endl;
                        }
                    }
                }

                cycles.clear();
            }

            if (counts[max] == 0) {
                if (trace >= 2) logger << "\033[1mlowering max\033[m for player " << (pl == 0 ? "even" : "odd") << std::endl;
                if (pl == 0) { while (max0 > 0 and counts[max0] == 0) max0 -= 2; }
                else { while (max1 > 0 and counts[max1] == 0) max1 -= 2; }
            }
        }

        if (todo.empty()) break;
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif

    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] cm;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}